

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

size_t parseBackslash(StringRef Src,size_t I,SmallString<128U> *Token)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  char local_23;
  char local_22;
  char local_21;
  
  uVar2 = Src.Length;
  uVar1 = (int)Src.Length - (int)I;
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    if ((I - uVar2) + 1 + uVar3 == 0) goto LAB_001688bd;
    if (uVar2 <= I + uVar3 + 1) {
      __assert_fail("Index < Length && \"Invalid index!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0xef,"char llvm::StringRef::operator[](size_t) const");
    }
    uVar4 = uVar3 + 1;
  } while (Src.Data[uVar3 + I + 1] == '\\');
  uVar1 = (uint)uVar4;
  if (Src.Data[uVar3 + I + 1] == '\"') {
    llvm::SmallVectorImpl<char>::append
              ((SmallVectorImpl<char> *)Token,uVar4 >> 1 & 0x7fffffff,&local_22);
    if (((int)uVar3 + 2U & 1) == 0) {
      sVar5 = I + uVar4;
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)Token,&local_23);
    }
    else {
      sVar5 = (I + uVar4) - 1;
    }
  }
  else {
    uVar2 = I + uVar4;
LAB_001688bd:
    sVar5 = uVar2 - 1;
    llvm::SmallVectorImpl<char>::append((SmallVectorImpl<char> *)Token,(ulong)uVar1,&local_21);
  }
  return sVar5;
}

Assistant:

static size_t parseBackslash(StringRef Src, size_t I, SmallString<128> &Token) {
  size_t E = Src.size();
  int BackslashCount = 0;
  // Skip the backslashes.
  do {
    ++I;
    ++BackslashCount;
  } while (I != E && Src[I] == '\\');

  bool FollowedByDoubleQuote = (I != E && Src[I] == '"');
  if (FollowedByDoubleQuote) {
    Token.append(BackslashCount / 2, '\\');
    if (BackslashCount % 2 == 0)
      return I - 1;
    Token.push_back('"');
    return I;
  }
  Token.append(BackslashCount, '\\');
  return I - 1;
}